

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall cmCPackGenerator::InstallProject(cmCPackGenerator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmCPackLog *pcVar3;
  long *plVar4;
  _Alloc_hider msg;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  bool bVar11;
  uint uVar12;
  long *__s;
  string bareTempInstallDirectory;
  string tempInstallDirectoryStr;
  ostringstream cmCPackLog_msg;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Install projects",0x10);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar3 = this->Logger;
  std::__cxx11::stringbuf::str();
  plVar4 = local_208;
  sVar9 = strlen((char *)local_208);
  cmCPackLog::Log(pcVar3,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0xc0,(char *)plVar4,sVar9);
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  CleanTemporaryDirectory(this);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_INSTALL_DIRECTORY","");
  pcVar10 = GetOption(this,(string *)local_1a8);
  std::__cxx11::string::string((string *)&local_208,pcVar10,(allocator *)local_1c8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,local_208,(long)local_208 + local_200);
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_SET_DESTDIR","");
  pcVar10 = GetOption(this,(string *)local_1a8);
  bVar5 = cmSystemTools::IsOn(pcVar10);
  paVar2 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CPACK_SET_DESTDIR","");
  pcVar10 = GetOption(this,&local_1e8);
  bVar6 = cmSystemTools::IsInternallyOn(pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  bVar11 = bVar5 || bVar6;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (!bVar5 && !bVar6) {
    (*(this->super_cmObject)._vptr_cmObject[0xc])(this);
    std::__cxx11::string::append((char *)local_1c8);
  }
  plVar4 = local_1c8[0];
  bVar7 = cmsys::SystemTools::MakeDirectory((char *)local_208);
  if (bVar7) {
    pcVar1 = local_1a8 + 0x10;
    local_1a8._0_8_ = pcVar1;
    if (bVar5 || bVar6) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"DESTDIR=","");
      std::__cxx11::string::append(local_1a8);
      cmsys::SystemTools::PutEnv((string *)local_1a8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"DESTDIR=","");
      cmsys::SystemTools::PutEnv((string *)local_1a8);
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)local_1a8,(char *)plVar4,(allocator *)&local_1e8);
    iVar8 = (*(this->super_cmObject)._vptr_cmObject[0x11])(this,(ulong)bVar11,local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    uVar12 = 0;
    if (iVar8 != 0) {
      std::__cxx11::string::string((string *)local_1a8,(char *)plVar4,(allocator *)&local_1e8);
      iVar8 = (*(this->super_cmObject)._vptr_cmObject[0x12])(this,(ulong)bVar11,local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (iVar8 != 0) {
        std::__cxx11::string::string((string *)local_1a8,(char *)plVar4,(allocator *)&local_1e8);
        iVar8 = (*(this->super_cmObject)._vptr_cmObject[0x13])(this,(ulong)bVar11,local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (iVar8 != 0) {
          iVar8 = (*(this->super_cmObject)._vptr_cmObject[0x14])(this,(ulong)bVar11,&local_208);
          if ((bVar5 || bVar6) && iVar8 != 0) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"DESTDIR=","");
            cmsys::SystemTools::PutEnv((string *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            uVar12 = 1;
          }
          else {
            uVar12 = (uint)(iVar8 != 0);
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Problem creating temporary directory: ",0x26);
    __s = (long *)"(NULL)";
    if (plVar4 != (long *)0x0) {
      __s = plVar4;
    }
    sVar9 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)__s,sVar9);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar3 = this->Logger;
    std::__cxx11::stringbuf::str();
    msg._M_p = local_1e8._M_dataplus._M_p;
    sVar9 = strlen(local_1e8._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0xd5,msg._M_p,sVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar12 = 0;
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  return uVar12;
}

Assistant:

int cmCPackGenerator::InstallProject()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Install projects" << std::endl);
  this->CleanTemporaryDirectory();

  std::string bareTempInstallDirectory
    = this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  std::string tempInstallDirectoryStr = bareTempInstallDirectory;
  bool setDestDir = cmSystemTools::IsOn(this->GetOption("CPACK_SET_DESTDIR"))
                  | cmSystemTools::IsInternallyOn(
                    this->GetOption("CPACK_SET_DESTDIR"));
  if (!setDestDir)
    {
    tempInstallDirectoryStr += this->GetPackagingInstallPrefix();
    }

  const char* tempInstallDirectory = tempInstallDirectoryStr.c_str();
  int res = 1;
  if ( !cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory.c_str()))
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Problem creating temporary directory: "
                  << (tempInstallDirectory ? tempInstallDirectory : "(NULL)")
                  << std::endl);
    return 0;
    }

  if ( setDestDir )
    {
    std::string destDir = "DESTDIR=";
    destDir += tempInstallDirectory;
    cmSystemTools::PutEnv(destDir);
    }
  else
    {
    // Make sure there is no destdir
    cmSystemTools::PutEnv("DESTDIR=");
    }

  // If the CPackConfig file sets CPACK_INSTALL_COMMANDS then run them
  // as listed
  if ( !this->InstallProjectViaInstallCommands(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }

  // If the CPackConfig file sets CPACK_INSTALL_SCRIPT then run them
  // as listed
  if ( !this->InstallProjectViaInstallScript(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }

  // If the CPackConfig file sets CPACK_INSTALLED_DIRECTORIES
  // then glob it and copy it to CPACK_TEMPORARY_DIRECTORY
  // This is used in Source packaging
  if ( !this->InstallProjectViaInstalledDirectories(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }


  // If the project is a CMAKE project then run pre-install
  // and then read the cmake_install script to run it
  if ( !this->InstallProjectViaInstallCMakeProjects(
         setDestDir, bareTempInstallDirectory) )
    {
    return 0;
    }

  if ( setDestDir )
    {
    cmSystemTools::PutEnv("DESTDIR=");
    }

  return res;
}